

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_without_glx.c
# Opt level: O2

EGLBoolean override_eglBindAPI(EGLenum api)

{
  EGLBoolean EVar1;
  undefined8 uVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  uVar2 = dlopen("libEGL.so.1",1);
  UNRECOVERED_JUMPTABLE = (code *)dlsym(uVar2,"eglBindAPI");
  if (api == 0x30a2) {
    extra_error = 1;
    return 0;
  }
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    EVar1 = (*UNRECOVERED_JUMPTABLE)(api);
    return EVar1;
  }
  __assert_fail("real_eglBindAPI",
                "/workspace/llm4binary/github/license_c_cmakelists/yaronct[P]libepoxy/test/egl_without_glx.c"
                ,0x42,"EGLBoolean override_eglBindAPI(EGLenum)");
}

Assistant:

static EGLBoolean
override_eglBindAPI(EGLenum api)
{
    void *egl = dlopen("libEGL.so.1", RTLD_LAZY | RTLD_LOCAL);
    EGLBoolean (*real_eglBindAPI)(EGLenum api) = dlsym(egl, "eglBindAPI");

    last_api = api;

    if (api == EGL_OPENGL_API) {
        extra_error = EGL_BAD_PARAMETER;
        return EGL_FALSE;
    }

    assert(real_eglBindAPI);
    return real_eglBindAPI(api);
}